

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

vector<MapConnection_*,_std::allocator<MapConnection_*>_> * __thiscall
World::map_connections
          (vector<MapConnection_*,_std::allocator<MapConnection_*>_> *__return_storage_ptr__,
          World *this,uint16_t map_id_1,uint16_t map_id_2)

{
  bool bVar1;
  uint16_t uVar2;
  MapConnection *local_60;
  MapConnection *local_58 [3];
  MapConnection *local_40;
  MapConnection *connection;
  iterator __end1;
  iterator __begin1;
  vector<MapConnection,_std::allocator<MapConnection>_> *__range1;
  uint16_t map_id_2_local;
  uint16_t map_id_1_local;
  World *this_local;
  vector<MapConnection_*,_std::allocator<MapConnection_*>_> *connections;
  
  std::vector<MapConnection_*,_std::allocator<MapConnection_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<MapConnection,_std::allocator<MapConnection>_>::begin
                     (&this->_map_connections);
  connection = (MapConnection *)
               std::vector<MapConnection,_std::allocator<MapConnection>_>::end
                         (&this->_map_connections);
  while (bVar1 = __gnu_cxx::
                 operator==<MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
                           (&__end1,(__normal_iterator<MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
                                     *)&connection), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = __gnu_cxx::
               __normal_iterator<MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
               ::operator*(&__end1);
    uVar2 = MapConnection::map_id_1(local_40);
    if ((uVar2 == map_id_1) && (uVar2 = MapConnection::map_id_2(local_40), uVar2 == map_id_2)) {
      local_58[0] = local_40;
      std::vector<MapConnection*,std::allocator<MapConnection*>>::emplace_back<MapConnection*>
                ((vector<MapConnection*,std::allocator<MapConnection*>> *)__return_storage_ptr__,
                 local_58);
    }
    uVar2 = MapConnection::map_id_1(local_40);
    if ((uVar2 == map_id_2) && (uVar2 = MapConnection::map_id_2(local_40), uVar2 == map_id_1)) {
      local_60 = local_40;
      std::vector<MapConnection*,std::allocator<MapConnection*>>::emplace_back<MapConnection*>
                ((vector<MapConnection*,std::allocator<MapConnection*>> *)__return_storage_ptr__,
                 &local_60);
    }
    __gnu_cxx::
    __normal_iterator<MapConnection_*,_std::vector<MapConnection,_std::allocator<MapConnection>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MapConnection*> World::map_connections(uint16_t map_id_1, uint16_t map_id_2)
{
    std::vector<MapConnection*> connections;
    for(MapConnection& connection : _map_connections)
    {
        if(connection.map_id_1() == map_id_1 && connection.map_id_2() == map_id_2)
            connections.emplace_back(&connection);
        if(connection.map_id_1() == map_id_2 && connection.map_id_2() == map_id_1)
            connections.emplace_back(&connection);
    }

    return connections;
}